

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTFWrapper.cpp
# Opt level: O0

bool __thiscall llvm::convertUTF16ToUTF8String(llvm *this,ArrayRef<char> SrcBytes,string *Out)

{
  UTF16 *pUVar1;
  bool bVar2;
  uint16_t uVar3;
  ConversionResult CVar4;
  ulong uVar5;
  size_t sVar6;
  size_type sVar7;
  reference pvVar8;
  UTF8 *pUVar9;
  long lVar10;
  ConversionResult CR;
  UTF8 *DstEnd;
  UTF8 *Dst;
  uint E;
  uint I;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_60;
  const_iterator local_58;
  undefined1 local_50 [8];
  vector<unsigned_short,_std::allocator<unsigned_short>_> ByteSwapped;
  UTF16 *SrcEnd;
  UTF16 *Src;
  string *Out_local;
  ArrayRef<char> SrcBytes_local;
  
  Src = (UTF16 *)SrcBytes.Length;
  SrcBytes_local.Data = SrcBytes.Data;
  Out_local = (string *)this;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    __assert_fail("Out.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                  ,0x58,"bool llvm::convertUTF16ToUTF8String(ArrayRef<char>, std::string &)");
  }
  sVar6 = ArrayRef<char>::size((ArrayRef<char> *)&Out_local);
  if ((sVar6 & 1) == 0) {
    bVar2 = ArrayRef<char>::empty((ArrayRef<char> *)&Out_local);
    if (bVar2) {
      SrcBytes_local.Length._7_1_ = 1;
    }
    else {
      SrcEnd = (UTF16 *)ArrayRef<char>::begin((ArrayRef<char> *)&Out_local);
      ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)ArrayRef<char>::end((ArrayRef<char> *)&Out_local);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
      if (*SrcEnd == 0xfffe) {
        local_60._M_current =
             (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
        __gnu_cxx::
        __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
        ::__normal_iterator<unsigned_short*>
                  ((__normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
                    *)&local_58,&local_60);
        _E = std::vector<unsigned_short,std::allocator<unsigned_short>>::
             insert<unsigned_short_const*,void>
                       ((vector<unsigned_short,std::allocator<unsigned_short>> *)local_50,local_58,
                        SrcEnd,ByteSwapped.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        Dst._4_4_ = 0;
        sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
        Dst._0_4_ = (uint)sVar7;
        for (; Dst._4_4_ != (uint)Dst; Dst._4_4_ = Dst._4_4_ + 1) {
          pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,
                              (ulong)Dst._4_4_);
          uVar3 = sys::SwapByteOrder_16(*pvVar8);
          pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                             ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,
                              (ulong)Dst._4_4_);
          *pvVar8 = uVar3;
        }
        SrcEnd = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,0);
        sVar7 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::size
                          ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
        pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                           ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50,
                            sVar7 - 1);
        ByteSwapped.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pvVar8 + 1;
      }
      pUVar1 = Src;
      if (*SrcEnd == 0xfeff) {
        SrcEnd = SrcEnd + 1;
      }
      ArrayRef<char>::size((ArrayRef<char> *)&Out_local);
      std::__cxx11::string::resize((ulong)pUVar1);
      pUVar9 = (UTF8 *)std::__cxx11::string::operator[]((ulong)Src);
      DstEnd = pUVar9;
      lVar10 = std::__cxx11::string::size();
      CVar4 = ConvertUTF16toUTF8(&SrcEnd,ByteSwapped.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage,&DstEnd,
                                 pUVar9 + lVar10,strictConversion);
      pUVar1 = Src;
      if (CVar4 == targetExhausted) {
        __assert_fail("CR != targetExhausted",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/ConvertUTFWrapper.cpp"
                      ,0x7b,"bool llvm::convertUTF16ToUTF8String(ArrayRef<char>, std::string &)");
      }
      if (CVar4 == conversionOK) {
        std::__cxx11::string::operator[]((ulong)Src);
        std::__cxx11::string::resize((ulong)pUVar1);
        std::__cxx11::string::push_back((char)Src);
        std::__cxx11::string::pop_back();
      }
      else {
        std::__cxx11::string::clear();
      }
      SrcBytes_local.Length._7_1_ = CVar4 == conversionOK;
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_50);
    }
  }
  else {
    SrcBytes_local.Length._7_1_ = 0;
  }
  return (bool)(SrcBytes_local.Length._7_1_ & 1);
}

Assistant:

bool convertUTF16ToUTF8String(ArrayRef<char> SrcBytes, std::string &Out) {
  assert(Out.empty());

  // Error out on an uneven byte count.
  if (SrcBytes.size() % 2)
    return false;

  // Avoid OOB by returning early on empty input.
  if (SrcBytes.empty())
    return true;

  const UTF16 *Src = reinterpret_cast<const UTF16 *>(SrcBytes.begin());
  const UTF16 *SrcEnd = reinterpret_cast<const UTF16 *>(SrcBytes.end());

  // Byteswap if necessary.
  std::vector<UTF16> ByteSwapped;
  if (Src[0] == UNI_UTF16_BYTE_ORDER_MARK_SWAPPED) {
    ByteSwapped.insert(ByteSwapped.end(), Src, SrcEnd);
    for (unsigned I = 0, E = ByteSwapped.size(); I != E; ++I)
      ByteSwapped[I] = llvm::sys::SwapByteOrder_16(ByteSwapped[I]);
    Src = &ByteSwapped[0];
    SrcEnd = &ByteSwapped[ByteSwapped.size() - 1] + 1;
  }

  // Skip the BOM for conversion.
  if (Src[0] == UNI_UTF16_BYTE_ORDER_MARK_NATIVE)
    Src++;

  // Just allocate enough space up front.  We'll shrink it later.  Allocate
  // enough that we can fit a null terminator without reallocating.
  Out.resize(SrcBytes.size() * UNI_MAX_UTF8_BYTES_PER_CODE_POINT + 1);
  UTF8 *Dst = reinterpret_cast<UTF8 *>(&Out[0]);
  UTF8 *DstEnd = Dst + Out.size();

  ConversionResult CR =
      ConvertUTF16toUTF8(&Src, SrcEnd, &Dst, DstEnd, strictConversion);
  assert(CR != targetExhausted);

  if (CR != conversionOK) {
    Out.clear();
    return false;
  }

  Out.resize(reinterpret_cast<char *>(Dst) - &Out[0]);
  Out.push_back(0);
  Out.pop_back();
  return true;
}